

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache::stats(tcp_cache *this,uint *keys,uint *triggers)

{
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  string data;
  tcp_operation_header h;
  int i;
  string *in_stack_000001c0;
  tcp_operation_header *in_stack_000001c8;
  messenger *in_stack_000001d0;
  string local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  int local_1c;
  int *local_18;
  int *local_10;
  
  *in_RSI = 0;
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x10); local_1c = local_1c + 1) {
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_28 = 0;
    std::__cxx11::string::string(local_68);
    local_48 = CONCAT44(local_48._4_4_,4);
    messenger::transmit(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    if ((int)local_48 == 10) {
      *local_10 = (int)local_38 + *local_10;
      *local_18 = local_38._4_4_ + *local_18;
    }
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void tcp_cache::stats(unsigned &keys,unsigned &triggers)
{
	keys=0; triggers=0;
	for(int i=0;i<conns;i++) {
		tcp_operation_header h=tcp_operation_header();
		std::string data;
		h.opcode=opcodes::stats;
		tcp[i].transmit(h,data);
		if(h.opcode==opcodes::out_stats) {
			keys+=h.operations.out_stats.keys;
			triggers+=h.operations.out_stats.triggers;
		}
	}
}